

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O2

void adjuststack(luaL_Buffer *B)

{
  lua_State *L;
  bool bVar1;
  bool bVar2;
  size_t sVar3;
  size_t sVar4;
  int iVar5;
  int idx;
  int n;
  int iVar6;
  int iVar7;
  
  if (1 < B->lvl) {
    L = B->L;
    sVar3 = lua_objlen(L,-1);
    iVar6 = 0;
    iVar5 = -1;
    do {
      idx = iVar5 + -1;
      sVar4 = lua_objlen(L,idx);
      bVar2 = iVar5 + B->lvl < 9;
      bVar1 = sVar3 <= sVar4;
      n = iVar6 + 1;
      if (bVar1 && bVar2) break;
      iVar7 = iVar6 + 2;
      sVar3 = sVar3 + sVar4;
      iVar6 = n;
      iVar5 = idx;
    } while (iVar7 < B->lvl);
    if (!bVar1 || !bVar2) {
      n = -idx;
    }
    lua_concat(L,n);
    B->lvl = (B->lvl - n) + 1;
  }
  return;
}

Assistant:

static void adjuststack (luaL_Buffer *B) {
  if (B->lvl > 1) {
    lua_State *L = B->L;
    int toget = 1;  /* number of levels to concat */
    size_t toplen = lua_strlen(L, -1);
    do {
      size_t l = lua_strlen(L, -(toget+1));
      if (B->lvl - toget + 1 >= LIMIT || toplen > l) {
        toplen += l;
        toget++;
      }
      else break;
    } while (toget < B->lvl);
    lua_concat(L, toget);
    B->lvl = B->lvl - toget + 1;
  }
}